

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnKill
          (RenX_LoggingPlugin *this,Server *server,string_view killer,TeamType *killerTeam,
          PlayerInfo *victim,string_view damageType)

{
  bool bVar1;
  __sv_type _Var2;
  undefined1 auVar3 [16];
  code *local_1c0;
  size_t local_148;
  char *local_140;
  size_t local_118;
  char *local_110;
  size_t local_f8;
  char *local_f0;
  size_t local_d8;
  char *local_d0;
  size_t local_b8;
  char *local_b0;
  size_t local_88;
  char *local_80;
  undefined1 local_68 [8];
  string msg;
  logFuncType func;
  PlayerInfo *victim_local;
  TeamType *killerTeam_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  string_view killer_local;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x19 & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_68,&this->killFmt2);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  if (!bVar1) {
    RenX::processTags((string *)local_68,server,(PlayerInfo *)0x0,victim,(BuildingInfo *)0x0);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0x208))
    ;
    auVar3 = RenX::translateName(killer._M_len,killer._M_str);
    local_88 = _Var2._M_len;
    local_80 = _Var2._M_str;
    RenX::replace_tag(local_68,local_88,local_80,auVar3._0_8_,auVar3._8_8_);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0x3a8))
    ;
    auVar3 = RenX::getTeamColor(*killerTeam);
    local_b8 = _Var2._M_len;
    local_b0 = _Var2._M_str;
    RenX::replace_tag(local_68,local_b8,local_b0,auVar3._0_8_,auVar3._8_8_);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0x3c8))
    ;
    auVar3 = RenX::getTeamName(*killerTeam);
    local_d8 = _Var2._M_len;
    local_d0 = _Var2._M_str;
    RenX::replace_tag(local_68,local_d8,local_d0,auVar3._0_8_,auVar3._8_8_);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 1000));
    auVar3 = RenX::getFullTeamName(*killerTeam);
    local_f8 = _Var2._M_len;
    local_f0 = _Var2._M_str;
    RenX::replace_tag(local_68,local_f8,local_f0,auVar3._0_8_,auVar3._8_8_);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(RenX::tags + 0x14c8));
    auVar3 = RenX::translateName(damageType._M_len,damageType._M_str);
    local_118 = _Var2._M_len;
    local_110 = _Var2._M_str;
    RenX::replace_tag(local_68,local_118,local_110,auVar3._0_8_,auVar3._8_8_);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_1c0 = (code *)msg.field_2._8_8_;
    }
    else {
      local_1c0 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    local_148 = _Var2._M_len;
    local_140 = _Var2._M_str;
    (*local_1c0)(server,local_148,local_140);
  }
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnKill(RenX::Server &server, std::string_view killer, const RenX::TeamType &killerTeam, const RenX::PlayerInfo &victim, std::string_view damageType)
{
	logFuncType func;
	if (RenX_LoggingPlugin::killPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->killFmt2;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, nullptr, &victim);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_NAME_TAG, RenX::translateName(killer));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(killerTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(killerTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(killerTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_WEAPON_TAG, RenX::translateName(damageType));
		(server.*func)(msg);
	}
}